

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PClass::InsertIntoHash(PClass *this)

{
  DObject *pDVar1;
  PClass *pPVar2;
  bool bVar3;
  int iVar4;
  PType *oldtype;
  char *pcVar5;
  PType *found;
  size_t bucket;
  PClass *this_local;
  
  pPVar2 = RegistrationInfo.MyClass;
  pDVar1 = (this->super_PStruct).super_PNamedType.Outer;
  bucket = (size_t)this;
  iVar4 = FName::operator_cast_to_int(&(this->super_PStruct).super_PNamedType.TypeName);
  oldtype = FTypeTable::FindType(&TypeTable,pPVar2,(intptr_t)pDVar1,(long)iVar4,(size_t *)&found);
  pPVar2 = RegistrationInfo.MyClass;
  if (oldtype == (PType *)0x0) {
    pDVar1 = (this->super_PStruct).super_PNamedType.Outer;
    iVar4 = FName::operator_cast_to_int(&(this->super_PStruct).super_PNamedType.TypeName);
    FTypeTable::AddType(&TypeTable,(PType *)this,pPVar2,(intptr_t)pDVar1,(long)iVar4,(size_t)found);
  }
  else {
    bVar3 = FBoolCVar::operator_cast_to_bool(&strictdecorate);
    if (bVar3) {
      pcVar5 = FName::GetChars(&(this->super_PStruct).super_PNamedType.TypeName);
      I_Error("Tried to register class \'%s\' more than once.\n",pcVar5);
    }
    else {
      pcVar5 = FName::GetChars(&(this->super_PStruct).super_PNamedType.TypeName);
      Printf("\x1cGTried to register class \'%s\' more than once.\n",pcVar5);
    }
    FTypeTable::ReplaceType(&TypeTable,(PType *)this,oldtype,(size_t)found);
  }
  return;
}

Assistant:

void PClass::InsertIntoHash ()
{
	size_t bucket;
	PType *found;

	found = TypeTable.FindType(RUNTIME_CLASS(PClass), (intptr_t)Outer, TypeName, &bucket);
	if (found != NULL)
	{ // This type has already been inserted
	  // ... but there is no need whatsoever to make it a fatal error!
		if (!strictdecorate) Printf (TEXTCOLOR_RED"Tried to register class '%s' more than once.\n", TypeName.GetChars());
		else I_Error("Tried to register class '%s' more than once.\n", TypeName.GetChars());
		TypeTable.ReplaceType(this, found, bucket);
	}
	else
	{
		TypeTable.AddType(this, RUNTIME_CLASS(PClass), (intptr_t)Outer, TypeName, bucket);
	}
}